

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
          (cmLocalUnixMakefileGenerator3 *this,ostream *cmakefileStream,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer pbVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  string *psVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  char *pcVar12;
  size_t sVar13;
  cmState *pcVar14;
  _Base_ptr p_Var15;
  char *pcVar16;
  _Rb_tree_header *p_Var17;
  long lVar18;
  long lVar19;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  string binaryDir;
  string cidVar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  undefined1 local_2c0 [32];
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  cmLocalUnixMakefileGenerator3 *local_280;
  allocator local_271;
  _Rb_tree_node_base *local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  undefined1 local_248 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  long local_218 [2];
  cmGeneratorTarget *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  ostream *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  long *local_198;
  long local_190;
  long local_188 [2];
  string local_178;
  long *local_158;
  long local_150;
  long local_148 [2];
  long *local_138;
  long local_130;
  long local_128 [2];
  _Iter_pred<(anonymous_namespace)::NotInProjectDir> local_118;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  string local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string *local_68;
  _Base_ptr local_60;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  local_280 = this;
  local_208 = target;
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
           ::operator[](&(this->ImplicitDepends).
                         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
                        ,psVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# The set of languages for which implicit dependencies are needed:\n",
             0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"set(CMAKE_DEPENDS_LANGUAGES\n",0x1c);
  p_Var17 = &(pmVar7->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
             )._M_t._M_impl.super__Rb_tree_header;
  for (p_Var9 = (pmVar7->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var17;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (cmakefileStream,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# The set of files for implicit dependencies of each language:\n",0x3f
            );
  p_Var15 = (pmVar7->
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
            )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60 = &p_Var17->_M_header;
  if ((_Rb_tree_header *)p_Var15 != p_Var17) {
    local_68 = &(local_280->super_cmLocalCommonGenerator).ConfigName;
    local_1c0 = cmakefileStream;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (cmakefileStream,"set(CMAKE_DEPENDS_CHECK_",0x18);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (cmakefileStream,*(char **)(p_Var15 + 1),(long)p_Var15[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      p_Var11 = p_Var15[2]._M_right;
      local_58 = (_Rb_tree_node_base *)&p_Var15[2]._M_parent;
      local_270 = p_Var15;
      if (p_Var11 != local_58) {
        do {
          poVar8 = local_1c0;
          p_Var15 = *(_Base_ptr *)(p_Var11 + 2);
          if (p_Var15 != p_Var11[2]._M_parent) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  \"",3);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8,*(char **)p_Var15,(long)p_Var15->_M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
              p_Var15 = p_Var15 + 1;
            } while (p_Var15 != p_Var11[2]._M_parent);
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != local_58);
      }
      cmakefileStream = local_1c0;
      std::__ostream_insert<char,std::char_traits<char>>(local_1c0,"  )\n",4);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_","");
      std::__cxx11::string::_M_append((char *)&local_b8,*(ulong *)(local_270 + 1));
      std::__cxx11::string::append((char *)&local_b8);
      pcVar12 = cmMakefile::GetDefinition
                          ((local_280->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile
                           ,&local_b8);
      if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (cmakefileStream,*(char **)(local_270 + 1),(long)local_270[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_COMPILER_ID \"",0xe);
        sVar13 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar12,sVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
      }
      p_Var15 = local_270 + 1;
      local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_98._M_impl.super__Rb_tree_header._M_header;
      local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._M_impl.super__Rb_tree_header._M_header._M_left;
      cmLocalGenerator::AddCompileDefinitions
                ((cmLocalGenerator *)local_280,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98,local_208,local_68,(string *)p_Var15);
      if (local_98._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"# Preprocessor definitions for this target.\n",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"set(CMAKE_TARGET_DEFINITIONS_",0x1d);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (cmakefileStream,*(char **)(local_270 + 1),(long)local_270[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        for (p_Var11 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var11 != &local_98._M_impl.super__Rb_tree_header;
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  ",2);
          cmOutputConverter::EscapeForCMake((string *)local_2c0,(string *)(p_Var11 + 1));
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (cmakefileStream,(char *)local_2c0._0_8_,local_2c0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
            operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (cmakefileStream,"# The include file search paths:\n",0x21);
      std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (cmakefileStream,*(char **)(local_270 + 1),(long)local_270[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_TARGET_INCLUDE_PATH\n",0x15);
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (local_280->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      local_2c0._0_8_ = local_2c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"CMAKE_BUILD_TYPE","");
      pcVar12 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_2c0);
      std::__cxx11::string::string((string *)&local_50,pcVar12,(allocator *)local_248);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      this_00 = local_280;
      cmLocalGenerator::GetIncludeDirectories
                ((cmLocalGenerator *)local_280,&local_268,local_208,(string *)p_Var15,&local_50,true
                );
      pcVar14 = cmLocalGenerator::GetState((cmLocalGenerator *)this_00);
      pcVar12 = cmState::GetBinaryDirectory(pcVar14);
      std::__cxx11::string::string((string *)&local_178,pcVar12,(allocator *)local_2c0);
      pcVar1 = (local_280->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      local_2c0._0_8_ = local_2c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c0,"CMAKE_DEPENDS_IN_PROJECT_ONLY","");
      bVar5 = cmMakefile::IsOn(pcVar1,(string *)local_2c0);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      psVar6 = local_268.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (bVar5) {
        pcVar14 = cmLocalGenerator::GetState((cmLocalGenerator *)local_280);
        pcVar12 = cmState::GetSourceDirectory(pcVar14);
        std::__cxx11::string::string((string *)&local_d8,pcVar12,&local_271);
        local_1b8 = local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_d8,local_d0 + (long)local_d8);
        local_198 = local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_178._M_dataplus._M_p,
                   local_178._M_dataplus._M_p + local_178._M_string_length);
        pbVar2 = local_268.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var20._M_current =
             local_268.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_158 = local_148;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_1b8,local_1b0 + (long)local_1b8);
        local_138 = local_128;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_198,local_190 + (long)local_198);
        local_200 = &local_1f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,local_158,local_150 + (long)local_158);
        local_1e0 = &local_1d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,local_138,local_130 + (long)local_138);
        uVar4 = local_1d0._M_allocated_capacity._0_4_;
        local_118._M_pred.BinaryDir._M_string_length = local_1d8;
        uVar3 = local_1f0._M_allocated_capacity._0_4_;
        local_118._M_pred.SourceDir._M_string_length = local_1f8;
        if (local_200 == &local_1f0) {
          local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_2c0 + 0x10);
          local_2c0._24_4_ = local_1f0._8_4_;
          local_2c0._28_4_ = local_1f0._12_4_;
        }
        local_2c0._20_4_ = local_1f0._M_allocated_capacity._4_4_;
        local_2c0._16_4_ = local_1f0._M_allocated_capacity._0_4_;
        local_1f8 = 0;
        local_1f0._M_allocated_capacity._0_4_ = local_1f0._M_allocated_capacity._0_4_ & 0xffffff00;
        if (local_1e0 == &local_1d0) {
          local_290._8_4_ = local_1d0._8_4_;
          local_290._12_4_ = local_1d0._12_4_;
          local_1e0 = &local_290;
        }
        local_290._M_allocated_capacity._4_4_ = local_1d0._M_allocated_capacity._4_4_;
        local_290._M_allocated_capacity._0_4_ = local_1d0._M_allocated_capacity._0_4_;
        local_1d8 = 0;
        local_1d0._M_allocated_capacity._0_4_ = local_1d0._M_allocated_capacity._0_4_ & 0xffffff00;
        local_118._M_pred.SourceDir._M_dataplus._M_p = (pointer)&local_118._M_pred.SourceDir.field_2
        ;
        if (local_200 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2c0 + 0x10)) {
          local_118._M_pred.SourceDir.field_2._M_allocated_capacity =
               CONCAT44(local_1f0._M_allocated_capacity._4_4_,uVar3);
          local_118._M_pred.SourceDir.field_2._8_4_ = local_2c0._24_4_;
          local_118._M_pred.SourceDir.field_2._12_4_ = local_2c0._28_4_;
        }
        else {
          local_118._M_pred.SourceDir.field_2._M_allocated_capacity = local_2c0._16_8_;
          local_118._M_pred.SourceDir._M_dataplus._M_p = (pointer)local_200;
        }
        local_118._M_pred.BinaryDir._M_dataplus._M_p = (pointer)&local_118._M_pred.BinaryDir.field_2
        ;
        if (local_1e0 == &local_290) {
          local_118._M_pred.BinaryDir.field_2._M_allocated_capacity =
               CONCAT44(local_1d0._M_allocated_capacity._4_4_,uVar4);
          local_118._M_pred.BinaryDir.field_2._8_4_ = local_290._8_4_;
          local_118._M_pred.BinaryDir.field_2._12_4_ = local_290._12_4_;
        }
        else {
          local_118._M_pred.BinaryDir.field_2._M_allocated_capacity =
               local_290._M_allocated_capacity;
          local_118._M_pred.BinaryDir._M_dataplus._M_p = (pointer)local_1e0;
        }
        local_248._0_8_ = local_248 + 0x10;
        local_200 = &local_1f0;
        local_1e0 = &local_1d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_248,local_118._M_pred.SourceDir._M_dataplus._M_p,
                   local_118._M_pred.SourceDir._M_dataplus._M_p +
                   local_118._M_pred.SourceDir._M_string_length);
        local_228._M_allocated_capacity = (size_type)local_218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,local_118._M_pred.BinaryDir._M_dataplus._M_p,
                   local_118._M_pred.BinaryDir._M_dataplus._M_p +
                   local_118._M_pred.BinaryDir._M_string_length);
        local_2c0._0_8_ = local_2c0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c0,local_248._0_8_,
                   (undefined1 *)
                   ((long)&((_Alloc_hider *)local_248._8_8_)->_M_p +
                   (long)&((_Alloc_hider *)local_248._0_8_)->_M_p));
        local_2a0._M_p = (pointer)&local_290;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a0,local_228._M_allocated_capacity,
                   local_228._8_8_ + local_228._M_allocated_capacity);
        lVar18 = (long)pbVar2 - (long)_Var20._M_current;
        if (0 < lVar18 >> 7) {
          lVar19 = (lVar18 >> 7) + 1;
          do {
            bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                              ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                               _Var20);
            __first._M_current = _Var20._M_current;
            if (bVar5) goto LAB_0044b1b3;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                              ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                               _Var20._M_current + 1);
            __first._M_current = _Var20._M_current + 1;
            if (bVar5) goto LAB_0044b1b3;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                              ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                               _Var20._M_current + 2);
            __first._M_current = _Var20._M_current + 2;
            if (bVar5) goto LAB_0044b1b3;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                              ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                               _Var20._M_current + 3);
            __first._M_current = _Var20._M_current + 3;
            if (bVar5) goto LAB_0044b1b3;
            _Var20._M_current = _Var20._M_current + 4;
            lVar19 = lVar19 + -1;
            lVar18 = lVar18 + -0x80;
          } while (1 < lVar19);
        }
        lVar18 = lVar18 >> 5;
        if (lVar18 == 1) {
LAB_0044b1a0:
          bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                            ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,_Var20)
          ;
          __first._M_current = _Var20._M_current;
          if (!bVar5) {
            __first._M_current = pbVar2;
          }
        }
        else if (lVar18 == 2) {
LAB_0044b182:
          bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                            ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,_Var20)
          ;
          __first._M_current = _Var20._M_current;
          if (!bVar5) {
            _Var20._M_current = _Var20._M_current + 1;
            goto LAB_0044b1a0;
          }
        }
        else {
          __first._M_current = pbVar2;
          if ((lVar18 == 3) &&
             (bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::
                      operator()((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)local_2c0,
                                 _Var20), __first._M_current = _Var20._M_current, !bVar5)) {
            _Var20._M_current = _Var20._M_current + 1;
            goto LAB_0044b182;
          }
        }
LAB_0044b1b3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_p != &local_290) {
          operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
        if ((long *)local_228._M_allocated_capacity != local_218) {
          operator_delete((void *)local_228._M_allocated_capacity,local_218[0] + 1);
        }
        if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
          operator_delete((void *)local_248._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_248._16_8_)->_M_p + 1));
        }
        _Var20._M_current = __first._M_current + 1;
        if (_Var20._M_current != pbVar2 && __first._M_current != pbVar2) {
          do {
            bVar5 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                              (&local_118,_Var20);
            if (!bVar5) {
              std::__cxx11::string::operator=
                        ((string *)__first._M_current,(string *)_Var20._M_current);
              __first._M_current = __first._M_current + 1;
            }
            _Var20._M_current = _Var20._M_current + 1;
          } while (_Var20._M_current != pbVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_pred.BinaryDir._M_dataplus._M_p != &local_118._M_pred.BinaryDir.field_2)
        {
          operator_delete(local_118._M_pred.BinaryDir._M_dataplus._M_p,
                          local_118._M_pred.BinaryDir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_pred.SourceDir._M_dataplus._M_p != &local_118._M_pred.SourceDir.field_2)
        {
          operator_delete(local_118._M_pred.SourceDir._M_dataplus._M_p,
                          local_118._M_pred.SourceDir.field_2._M_allocated_capacity + 1);
        }
        if (local_1e0 != &local_1d0) {
          operator_delete(local_1e0,
                          CONCAT44(local_1d0._M_allocated_capacity._4_4_,
                                   local_1d0._M_allocated_capacity._0_4_) + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,
                          CONCAT44(local_1f0._M_allocated_capacity._4_4_,
                                   local_1f0._M_allocated_capacity._0_4_) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_268,(iterator)__first._M_current,
                   (iterator)
                   local_268.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        if (local_138 != local_128) {
          operator_delete(local_138,local_128[0] + 1);
        }
        if (local_158 != local_148) {
          operator_delete(local_158,local_148[0] + 1);
        }
        if (local_198 != local_188) {
          operator_delete(local_198,local_188[0] + 1);
        }
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        psVar6 = local_268.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
          psVar6 = local_268.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      for (; psVar6 != local_268.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; psVar6 = psVar6 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
        MaybeConvertToRelativePath((string *)local_2c0,local_280,&local_178,psVar6);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (cmakefileStream,(char *)local_2c0._0_8_,local_2c0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
        if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_268);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(local_270);
    } while (p_Var15 != local_60);
  }
  local_248._0_8_ = (string *)0x0;
  local_248._8_8_ = (string *)0x0;
  local_248._16_8_ = (pointer)0x0;
  pcVar1 = (local_280->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  pcVar12 = local_2c0 + 0x10;
  local_2c0._0_8_ = pcVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
  pcVar16 = cmMakefile::GetProperty(pcVar1,(string *)local_2c0);
  if ((char *)local_2c0._0_8_ != pcVar12) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (pcVar16 != (char *)0x0) {
    local_2c0._0_8_ = pcVar12;
    sVar13 = strlen(pcVar16);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,pcVar16,pcVar16 + sVar13);
    cmSystemTools::ExpandListArgument
              ((string *)local_2c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_248,false);
    if ((char *)local_2c0._0_8_ != pcVar12) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
  }
  local_2c0._0_8_ = pcVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
  pcVar16 = cmGeneratorTarget::GetProperty(local_208,(string *)local_2c0);
  if ((char *)local_2c0._0_8_ != pcVar12) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (pcVar16 != (char *)0x0) {
    local_2c0._0_8_ = pcVar12;
    sVar13 = strlen(pcVar16);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,pcVar16,pcVar16 + sVar13);
    cmSystemTools::ExpandListArgument
              ((string *)local_2c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_248,false);
    if ((char *)local_2c0._0_8_ != pcVar12) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
  }
  if (local_248._0_8_ != local_248._8_8_) {
    std::__ostream_insert<char,std::char_traits<char>>
              (cmakefileStream,"set(CMAKE_INCLUDE_TRANSFORMS\n",0x1d);
    if (local_248._0_8_ != local_248._8_8_) {
      psVar6 = (string *)local_248._0_8_;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  ",2);
        cmOutputConverter::EscapeForCMake((string *)local_2c0,psVar6);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (cmakefileStream,(char *)local_2c0._0_8_,local_2c0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if ((char *)local_2c0._0_8_ != pcVar12) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
        psVar6 = psVar6 + 1;
      } while (psVar6 != (string *)local_248._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_248);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo(
  std::ostream& cmakefileStream, cmGeneratorTarget* target)
{
  ImplicitDependLanguageMap const& implicitLangs =
    this->GetImplicitDepends(target);

  // list the languages
  cmakefileStream
    << "# The set of languages for which implicit dependencies are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_LANGUAGES\n";
  for (ImplicitDependLanguageMap::const_iterator l = implicitLangs.begin();
       l != implicitLangs.end(); ++l) {
    cmakefileStream << "  \"" << l->first << "\"\n";
  }
  cmakefileStream << "  )\n";

  // now list the files for each language
  cmakefileStream
    << "# The set of files for implicit dependencies of each language:\n";
  for (ImplicitDependLanguageMap::const_iterator l = implicitLangs.begin();
       l != implicitLangs.end(); ++l) {
    cmakefileStream << "set(CMAKE_DEPENDS_CHECK_" << l->first << "\n";
    ImplicitDependFileMap const& implicitPairs = l->second;

    // for each file pair
    for (ImplicitDependFileMap::const_iterator pi = implicitPairs.begin();
         pi != implicitPairs.end(); ++pi) {
      for (cmDepends::DependencyVector::const_iterator di = pi->second.begin();
           di != pi->second.end(); ++di) {
        cmakefileStream << "  \"" << *di << "\" ";
        cmakefileStream << "\"" << pi->first << "\"\n";
      }
    }
    cmakefileStream << "  )\n";

    // Tell the dependency scanner what compiler is used.
    std::string cidVar = "CMAKE_";
    cidVar += l->first;
    cidVar += "_COMPILER_ID";
    const char* cid = this->Makefile->GetDefinition(cidVar);
    if (cid && *cid) {
      cmakefileStream << "set(CMAKE_" << l->first << "_COMPILER_ID \"" << cid
                      << "\")\n";
    }

    // Build a list of preprocessor definitions for the target.
    std::set<std::string> defines;
    this->AddCompileDefinitions(defines, target, this->ConfigName, l->first);
    if (!defines.empty()) {
      /* clang-format off */
      cmakefileStream
        << "\n"
        << "# Preprocessor definitions for this target.\n"
        << "set(CMAKE_TARGET_DEFINITIONS_" << l->first << "\n";
      /* clang-format on */
      for (std::set<std::string>::const_iterator di = defines.begin();
           di != defines.end(); ++di) {
        cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(*di)
                        << "\n";
      }
      cmakefileStream << "  )\n";
    }

    // Target-specific include directories:
    cmakefileStream << "\n"
                    << "# The include file search paths:\n";
    cmakefileStream << "set(CMAKE_" << l->first << "_TARGET_INCLUDE_PATH\n";
    std::vector<std::string> includes;

    const std::string& config =
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    this->GetIncludeDirectories(includes, target, l->first, config);
    std::string binaryDir = this->GetState()->GetBinaryDirectory();
    if (this->Makefile->IsOn("CMAKE_DEPENDS_IN_PROJECT_ONLY")) {
      const char* sourceDir = this->GetState()->GetSourceDirectory();
      cmEraseIf(includes, ::NotInProjectDir(sourceDir, binaryDir));
    }
    for (std::vector<std::string>::iterator i = includes.begin();
         i != includes.end(); ++i) {
      cmakefileStream << "  \""
                      << this->MaybeConvertToRelativePath(binaryDir, *i)
                      << "\"\n";
    }
    cmakefileStream << "  )\n";
  }

  // Store include transform rule properties.  Write the directory
  // rules first because they may be overridden by later target rules.
  std::vector<std::string> transformRules;
  if (const char* xform =
        this->Makefile->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
    cmSystemTools::ExpandListArgument(xform, transformRules);
  }
  if (const char* xform =
        target->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
    cmSystemTools::ExpandListArgument(xform, transformRules);
  }
  if (!transformRules.empty()) {
    cmakefileStream << "set(CMAKE_INCLUDE_TRANSFORMS\n";
    for (std::vector<std::string>::const_iterator tri = transformRules.begin();
         tri != transformRules.end(); ++tri) {
      cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(*tri)
                      << "\n";
    }
    cmakefileStream << "  )\n";
  }
}